

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesPathWidget.cxx
# Opt level: O3

void __thiscall
cmCursesPathWidget::cmCursesPathWidget
          (cmCursesPathWidget *this,int width,int height,int left,int top)

{
  cmCursesStringWidget::cmCursesStringWidget
            (&this->super_cmCursesStringWidget,width,height,left,top);
  (this->super_cmCursesStringWidget).super_cmCursesWidget._vptr_cmCursesWidget =
       (_func_int **)&PTR__cmCursesPathWidget_005c2ce0;
  (this->LastString)._M_dataplus._M_p = (pointer)&(this->LastString).field_2;
  (this->LastString)._M_string_length = 0;
  (this->LastString).field_2._M_local_buf[0] = '\0';
  (this->LastGlob)._M_dataplus._M_p = (pointer)&(this->LastGlob).field_2;
  (this->LastGlob)._M_string_length = 0;
  (this->LastGlob).field_2._M_local_buf[0] = '\0';
  (this->super_cmCursesStringWidget).super_cmCursesWidget.Type = PATH;
  this->Cycle = false;
  this->CurrentIndex = 0;
  return;
}

Assistant:

cmCursesPathWidget::cmCursesPathWidget(int width, int height,
                                           int left, int top) :
  cmCursesStringWidget(width, height, left, top)
{
  this->Type = cmState::PATH;
  this->Cycle = false;
  this->CurrentIndex = 0;
}